

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::UnsafeArenaSwap
          (RepeatedField<absl::lts_20250127::Cord> *this,
          RepeatedField<absl::lts_20250127::Cord> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  HeapRep *pHVar3;
  
  if (this == other) {
    return;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pAVar1 = protobuf::internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    pHVar3 = heap_rep(this);
    pAVar1 = (pHVar3->field_0).arena;
  }
  if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pAVar2 = protobuf::internal::SooRep::soo_arena(&other->soo_rep_);
  }
  else {
    pHVar3 = heap_rep(other);
    pAVar2 = (pHVar3->field_0).arena;
  }
  if (pAVar1 == pAVar2) {
    InternalSwap(this,other);
    return;
  }
  UnsafeArenaSwap();
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}